

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O1

void __thiscall
antlr::CharScanner::CharScanner(CharScanner *this,InputBuffer *cb,bool case_sensitive)

{
  _Rb_tree_header *p_Var1;
  LexerInputState *pLVar2;
  Ref *pRVar3;
  
  (this->super_TokenStream)._vptr_TokenStream = (_func_int **)&PTR___cxa_pure_virtual_002439c8;
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  (this->text)._M_string_length = 0;
  (this->text).field_2._M_local_buf[0] = '\0';
  this->saveConsumedInput = true;
  this->caseSensitive = case_sensitive;
  (this->literals)._M_t._M_impl.super__Rb_tree_key_compare<antlr::CharScannerLiteralsLess>.
  _M_key_compare.scanner = this;
  p_Var1 = &(this->literals)._M_t._M_impl.super__Rb_tree_header;
  (this->literals)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->literals)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->literals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->literals)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->literals)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_returnToken).ref = (TokenRef *)0x0;
  pLVar2 = (LexerInputState *)operator_new(0x50);
  pLVar2->_vptr_LexerInputState = (_func_int **)&PTR_initialize_00243f70;
  pLVar2->column = 1;
  pLVar2->line = 1;
  pLVar2->tokenStartColumn = 1;
  pLVar2->tokenStartLine = 1;
  pLVar2->guessing = 0;
  (pLVar2->filename)._M_dataplus._M_p = (pointer)&(pLVar2->filename).field_2;
  (pLVar2->filename)._M_string_length = 0;
  (pLVar2->filename).field_2._M_local_buf[0] = '\0';
  pLVar2->input = cb;
  pLVar2->inputResponsible = true;
  pRVar3 = (Ref *)operator_new(0x10);
  pRVar3->ptr = pLVar2;
  pRVar3->count = 1;
  (this->inputState).ref = pRVar3;
  this->commitToPath = false;
  this->tabsize = 8;
  this->traceDepth = 0;
  this->tokenFactory = CommonToken::factory;
  return;
}

Assistant:

CharScanner::CharScanner(InputBuffer* cb, bool case_sensitive )
	: saveConsumedInput(true) //, caseSensitiveLiterals(true)
	, caseSensitive(case_sensitive)
	, literals(CharScannerLiteralsLess(this))
	, inputState(new LexerInputState(cb))
	, commitToPath(false)
	, tabsize(8)
	, traceDepth(0)
{
	setTokenObjectFactory(&CommonToken::factory);
}